

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlStrncat(xmlChar *cur,xmlChar *add,int len)

{
  int iVar1;
  xmlChar *ret;
  int size;
  int len_local;
  xmlChar *add_local;
  xmlChar *cur_local;
  
  cur_local = cur;
  if ((add != (xmlChar *)0x0) && (len != 0)) {
    if (len < 0) {
      cur_local = (xmlChar *)0x0;
    }
    else if (cur == (xmlChar *)0x0) {
      cur_local = xmlStrndup(add,len);
    }
    else {
      iVar1 = xmlStrlen(cur);
      if ((iVar1 < 0) || (0x7fffffff - len < iVar1)) {
        cur_local = (xmlChar *)0x0;
      }
      else {
        cur_local = (xmlChar *)(*xmlRealloc)(cur,(long)iVar1 + (long)len + 1);
        if (cur_local == (xmlChar *)0x0) {
          xmlErrMemory((xmlParserCtxtPtr)0x0,(char *)0x0);
          cur_local = cur;
        }
        else {
          memcpy(cur_local + iVar1,add,(long)len);
          cur_local[iVar1 + len] = '\0';
        }
      }
    }
  }
  return cur_local;
}

Assistant:

xmlChar *
xmlStrncat(xmlChar *cur, const xmlChar *add, int len) {
    int size;
    xmlChar *ret;

    if ((add == NULL) || (len == 0))
        return(cur);
    if (len < 0)
	return(NULL);
    if (cur == NULL)
        return(xmlStrndup(add, len));

    size = xmlStrlen(cur);
    if ((size < 0) || (size > INT_MAX - len))
        return(NULL);
    ret = (xmlChar *) xmlRealloc(cur, (size_t) size + len + 1);
    if (ret == NULL) {
        xmlErrMemory(NULL, NULL);
        return(cur);
    }
    memcpy(&ret[size], add, len);
    ret[size + len] = 0;
    return(ret);
}